

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O2

void * hugeOpen(char *URI)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char **ppcVar3;
  long lVar4;
  
  if ((URI != (char *)0x0) && (iVar1 = strncmp(URI,"huge:",5), iVar1 == 0)) {
    ppcVar3 = &hugeTests[0].start;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      iVar1 = strcmp(ppcVar3[-1],URI);
      if (iVar1 == 0) {
        currentTest = (uint)lVar4;
        __s = *ppcVar3;
        sVar2 = strlen(__s);
        rlen = (int)sVar2;
        current = __s;
        instate = 0;
        return __s;
      }
      ppcVar3 = ppcVar3 + 4;
    }
    currentTest = 4;
  }
  return (void *)0x0;
}

Assistant:

static void *
hugeOpen(const char * URI) {
    if ((URI == NULL) || (strncmp(URI, "huge:", 5)))
        return(NULL);

    for (currentTest = 0;currentTest < sizeof(hugeTests)/sizeof(hugeTests[0]);
         currentTest++)
         if (!strcmp(hugeTests[currentTest].name, URI))
             goto found;

    return(NULL);

found:
    rlen = strlen(hugeTests[currentTest].start);
    current = hugeTests[currentTest].start;
    instate = 0;
    return((void *) current);
}